

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAcroFormDocumentHelper.cc
# Opt level: O0

set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> * __thiscall
QPDFAcroFormDocumentHelper::getFieldsWithQualifiedName
          (set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
           *__return_storage_ptr__,QPDFAcroFormDocumentHelper *this,string *name)

{
  bool bVar1;
  element_type *peVar2;
  pointer ppVar3;
  _Self local_30;
  _Self local_28;
  iterator iter;
  string *name_local;
  QPDFAcroFormDocumentHelper *this_local;
  
  iter._M_node = (_Base_ptr)name;
  analyze(this);
  peVar2 = std::
           __shared_ptr_access<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
       ::find(&peVar2->name_to_fields,iter._M_node);
  peVar2 = std::
           __shared_ptr_access<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
       ::end(&peVar2->name_to_fields);
  bVar1 = std::operator!=(&local_28,&local_30);
  if (bVar1) {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>
             ::operator->(&local_28);
    std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::set
              (__return_storage_ptr__,&ppVar3->second);
  }
  else {
    memset(__return_storage_ptr__,0,0x30);
    std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::set
              (__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<QPDFObjGen>
QPDFAcroFormDocumentHelper::getFieldsWithQualifiedName(std::string const& name)
{
    analyze();
    // Keep from creating an empty entry
    auto iter = m->name_to_fields.find(name);
    if (iter != m->name_to_fields.end()) {
        return iter->second;
    }
    return {};
}